

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void main_loop(GPU_Target *screen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SDL_Event event;
  
  bVar1 = false;
  while (!bVar1) {
    bVar2 = false;
    while (bVar1 = bVar2, iVar3 = SDL_PollEvent(&event), iVar3 != 0) {
      bVar2 = true;
      if ((event.type != 0x100) &&
         (bVar2 = bVar1, event.window.data2 == 0x1b && event.type == 0x300)) {
        bVar2 = true;
      }
    }
    GPU_Clear(screen);
    GPU_Flip(screen);
  }
  return;
}

Assistant:

void main_loop(GPU_Target* screen)
{
    Uint8 done;
    SDL_Event event;
    
    done = 0;
    while(!done)
    {
        while(SDL_PollEvent(&event))
        {
            if(event.type == SDL_QUIT)
                done = 1;
            else if(event.type == SDL_KEYDOWN)
            {
                if(event.key.keysym.sym == SDLK_ESCAPE)
                    done = 1;
            }
        }
        
        // Update logic here
        
        GPU_Clear(screen);
        
        // Draw stuff here
        
        GPU_Flip(screen);
    }
}